

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expr * __thiscall parser::Parser::parseBoolean(Parser *this)

{
  bool bVar1;
  Parser *pPVar2;
  Token local_88;
  undefined1 local_55;
  Token local_48;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  bVar1 = curTokenIs(this,TRUE);
  if (bVar1) {
    pPVar2 = (Parser *)operator_new(0x48);
    local_55 = 1;
    token::Token::Token(&local_48,&this->curToken);
    ast::BooleanExpr::BooleanExpr((BooleanExpr *)pPVar2,&local_48,true,this->l->line);
    local_55 = 0;
    this_local = pPVar2;
    token::Token::~Token(&local_48);
  }
  else {
    pPVar2 = (Parser *)operator_new(0x48);
    token::Token::Token(&local_88,&this->curToken);
    ast::BooleanExpr::BooleanExpr((BooleanExpr *)pPVar2,&local_88,false,this->l->line);
    this_local = pPVar2;
    token::Token::~Token(&local_88);
  }
  return (Expr *)this_local;
}

Assistant:

Expr* Parser::parseBoolean()
{
    if(curTokenIs(TokenType::TRUE))
        return new BooleanExpr(curToken, true, l->line);
    return new BooleanExpr(curToken, false, l->line);
}